

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::terminate(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  uint uVar1;
  uint uVar2;
  SPxSense SVar3;
  Real RVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  SPxOut *pSVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  long lVar15;
  long in_FS_OFFSET;
  byte bVar16;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  long local_4c8;
  Real local_4c0;
  cpp_dec_float<200U,_int,_void> local_4b8;
  cpp_dec_float<200U,_int,_void> local_438;
  cpp_dec_float<200U,_int,_void> local_3b8;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b8;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar16 = 0;
  uVar1 = (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).iterCount;
  if (10 < (int)uVar1) {
    uVar2 = (this->thecovectors->set).thenum;
    uVar11 = 1000;
    if (1000 < (int)uVar2) {
      uVar11 = (ulong)uVar2;
    }
    if ((int)((ulong)uVar1 % uVar11) == 0) {
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[(ulong)(this->theType != ENTER) + 0x7c])(this);
      computeFrhs(this);
      if (1 < (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).updateCount) {
        pSVar8 = this->spxout;
        if ((pSVar8 != (SPxOut *)0x0) && (4 < (int)pSVar8->m_verbosity)) {
          local_4b8.data._M_elems[0] = pSVar8->m_verbosity;
          local_438.data._M_elems[0] = 5;
          (*pSVar8->_vptr_SPxOut[2])();
          pSVar8 = this->spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar8->m_streams[pSVar8->m_verbosity],
                     " --- terminate triggers refactorization",0x27);
          cVar5 = (char)pSVar8->m_streams[pSVar8->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar8->m_streams[pSVar8->m_verbosity] + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_4b8);
        }
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x75])(this);
      }
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::coSolve(&this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&this->theCoPvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,this->theCoPrhs);
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solve(&this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&this->theFvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,this->theFrhs);
      if ((this->thePricing == FULL) && (computePvec(this), this->theType == ENTER)) {
        computeCoTest(this);
        computeTest(this);
      }
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x6d])(&local_438);
      if (local_438.fpclass != cpp_dec_float_NaN) {
        local_4b8.fpclass = cpp_dec_float_finite;
        local_4b8.prec_elem = 0x1c;
        local_4b8.data._M_elems[0] = 0;
        local_4b8.data._M_elems[1] = 0;
        local_4b8.data._M_elems[2] = 0;
        local_4b8.data._M_elems[3] = 0;
        local_4b8.data._M_elems[4] = 0;
        local_4b8.data._M_elems[5] = 0;
        local_4b8.data._M_elems[6] = 0;
        local_4b8.data._M_elems[7] = 0;
        local_4b8.data._M_elems[8] = 0;
        local_4b8.data._M_elems[9] = 0;
        local_4b8.data._M_elems[10] = 0;
        local_4b8.data._M_elems[0xb] = 0;
        local_4b8.data._M_elems[0xc] = 0;
        local_4b8.data._M_elems[0xd] = 0;
        local_4b8.data._M_elems[0xe] = 0;
        local_4b8.data._M_elems[0xf] = 0;
        local_4b8.data._M_elems[0x10] = 0;
        local_4b8.data._M_elems[0x11] = 0;
        local_4b8.data._M_elems[0x12] = 0;
        local_4b8.data._M_elems[0x13] = 0;
        local_4b8.data._M_elems[0x14] = 0;
        local_4b8.data._M_elems[0x15] = 0;
        local_4b8.data._M_elems[0x16] = 0;
        local_4b8.data._M_elems[0x17] = 0;
        local_4b8.data._M_elems[0x18] = 0;
        local_4b8.data._M_elems[0x19] = 0;
        local_4b8.data._M_elems._104_5_ = 0;
        local_4b8.data._M_elems[0x1b]._1_3_ = 0;
        local_4b8.exp = 0;
        local_4b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_4b8,0.0);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_438,&local_4b8);
        if (0 < iVar7) {
          (*(this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x6e])(this);
        }
      }
    }
  }
  bVar10 = true;
  iVar7 = 0;
  lVar15 = 0x674;
  if ((uint)(this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thestatus < 3) {
    bVar6 = isTimeLimitReached(this,false);
    if (bVar6) {
      pSVar8 = this->spxout;
      iVar7 = -7;
      if ((pSVar8 != (SPxOut *)0x0) && (3 < (int)pSVar8->m_verbosity)) {
        local_4b8.data._M_elems[0] = pSVar8->m_verbosity;
        local_438.data._M_elems[0] = 4;
        (*pSVar8->_vptr_SPxOut[2])();
        pSVar8 = this->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar8->m_streams[pSVar8->m_verbosity]," --- timelimit (",0x10);
        std::ostream::_M_insert<double>(this->maxTime);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar8->m_streams[pSVar8->m_verbosity],") reached",9);
        cVar5 = (char)pSVar8->m_streams[pSVar8->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar8->m_streams[pSVar8->m_verbosity] + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_4b8);
      }
    }
    else {
      ::soplex::infinity::__tls_init();
      local_4b8.fpclass = cpp_dec_float_finite;
      local_4b8.prec_elem = 0x1c;
      local_4b8.data._M_elems[0] = 0;
      local_4b8.data._M_elems[1] = 0;
      local_4b8.data._M_elems[2] = 0;
      local_4b8.data._M_elems[3] = 0;
      local_4b8.data._M_elems[4] = 0;
      local_4b8.data._M_elems[5] = 0;
      local_4b8.data._M_elems[6] = 0;
      local_4b8.data._M_elems[7] = 0;
      local_4b8.data._M_elems[8] = 0;
      local_4b8.data._M_elems[9] = 0;
      local_4b8.data._M_elems[10] = 0;
      local_4b8.data._M_elems[0xb] = 0;
      local_4b8.data._M_elems[0xc] = 0;
      local_4b8.data._M_elems[0xd] = 0;
      local_4b8.data._M_elems[0xe] = 0;
      local_4b8.data._M_elems[0xf] = 0;
      local_4b8.data._M_elems[0x10] = 0;
      local_4b8.data._M_elems[0x11] = 0;
      local_4b8.data._M_elems[0x12] = 0;
      local_4b8.data._M_elems[0x13] = 0;
      local_4b8.data._M_elems[0x14] = 0;
      local_4b8.data._M_elems[0x15] = 0;
      local_4b8.data._M_elems[0x16] = 0;
      local_4b8.data._M_elems[0x17] = 0;
      local_4b8.data._M_elems[0x18] = 0;
      local_4b8.data._M_elems[0x19] = 0;
      local_4b8.data._M_elems._104_5_ = 0;
      local_4b8.data._M_elems[0x1b]._1_3_ = 0;
      local_4b8.exp = 0;
      local_4b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_4b8,*(double *)(in_FS_OFFSET + -8));
      if (((this->objLimit).m_backend.fpclass != cpp_dec_float_NaN) &&
         (local_4b8.fpclass != cpp_dec_float_NaN)) {
        this_00 = &this->objLimit;
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&this_00->m_backend,&local_4b8);
        if ((iVar7 < 0) && (0 < this->theRep * this->theType)) {
          (*(this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x6d])(&local_438,this);
          RVar4 = Tolerances::epsilon((this->
                                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      )._tolerances.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
          local_3b8.fpclass = cpp_dec_float_finite;
          local_3b8.prec_elem = 0x1c;
          local_3b8.data._M_elems[0] = 0;
          local_3b8.data._M_elems[1] = 0;
          local_3b8.data._M_elems[2] = 0;
          local_3b8.data._M_elems[3] = 0;
          local_3b8.data._M_elems[4] = 0;
          local_3b8.data._M_elems[5] = 0;
          local_3b8.data._M_elems[6] = 0;
          local_3b8.data._M_elems[7] = 0;
          local_3b8.data._M_elems[8] = 0;
          local_3b8.data._M_elems[9] = 0;
          local_3b8.data._M_elems[10] = 0;
          local_3b8.data._M_elems[0xb] = 0;
          local_3b8.data._M_elems[0xc] = 0;
          local_3b8.data._M_elems[0xd] = 0;
          local_3b8.data._M_elems[0xe] = 0;
          local_3b8.data._M_elems[0xf] = 0;
          local_3b8.data._M_elems[0x10] = 0;
          local_3b8.data._M_elems[0x11] = 0;
          local_3b8.data._M_elems[0x12] = 0;
          local_3b8.data._M_elems[0x13] = 0;
          local_3b8.data._M_elems[0x14] = 0;
          local_3b8.data._M_elems[0x15] = 0;
          local_3b8.data._M_elems[0x16] = 0;
          local_3b8.data._M_elems[0x17] = 0;
          local_3b8.data._M_elems[0x18] = 0;
          local_3b8.data._M_elems[0x19] = 0;
          local_3b8.data._M_elems._104_5_ = 0;
          local_3b8.data._M_elems[0x1b]._1_3_ = 0;
          local_3b8.exp = 0;
          local_3b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_3b8,RVar4);
          if (((local_438.fpclass != cpp_dec_float_NaN) && (local_3b8.fpclass != cpp_dec_float_NaN))
             && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_438,&local_3b8), iVar7 < 0)) {
            RVar4 = Tolerances::floatingPointOpttol
                              ((this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x6d])(&local_338,this);
            local_4b8.fpclass = cpp_dec_float_finite;
            local_4b8.prec_elem = 0x1c;
            local_4b8.data._M_elems[0] = 0;
            local_4b8.data._M_elems[1] = 0;
            local_4b8.data._M_elems[2] = 0;
            local_4b8.data._M_elems[3] = 0;
            local_4b8.data._M_elems[4] = 0;
            local_4b8.data._M_elems[5] = 0;
            local_4b8.data._M_elems[6] = 0;
            local_4b8.data._M_elems[7] = 0;
            local_4b8.data._M_elems[8] = 0;
            local_4b8.data._M_elems[9] = 0;
            local_4b8.data._M_elems[10] = 0;
            local_4b8.data._M_elems[0xb] = 0;
            local_4b8.data._M_elems[0xc] = 0;
            local_4b8.data._M_elems[0xd] = 0;
            local_4b8.data._M_elems[0xe] = 0;
            local_4b8.data._M_elems[0xf] = 0;
            local_4b8.data._M_elems[0x10] = 0;
            local_4b8.data._M_elems[0x11] = 0;
            local_4b8.data._M_elems[0x12] = 0;
            local_4b8.data._M_elems[0x13] = 0;
            local_4b8.data._M_elems[0x14] = 0;
            local_4b8.data._M_elems[0x15] = 0;
            local_4b8.data._M_elems[0x16] = 0;
            local_4b8.data._M_elems[0x17] = 0;
            local_4b8.data._M_elems[0x18] = 0;
            local_4b8.data._M_elems[0x19] = 0;
            local_4b8.data._M_elems._104_5_ = 0;
            local_4b8.data._M_elems[0x1b]._1_3_ = 0;
            local_4b8.exp = 0;
            local_4b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_4b8,RVar4);
            pcVar12 = &local_338;
            pcVar13 = &local_2b8;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar16 * -8 + 4);
            }
            local_2b8.exp = local_338.exp;
            local_2b8.neg = local_338.neg;
            local_2b8.fpclass = local_338.fpclass;
            local_2b8.prec_elem = local_338.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_2b8,&local_4b8);
            if (local_2b8.data._M_elems[0] != 0 || local_2b8.fpclass != cpp_dec_float_finite) {
              local_2b8.neg = (bool)(local_2b8.neg ^ 1);
            }
            iVar7 = (*(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._vptr_ClassArray[0x74])(this,&local_2b8);
            if ((char)iVar7 != '\0') {
              SVar3 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesense;
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x5e])(&local_438,this);
              local_4b8.fpclass = cpp_dec_float_finite;
              local_4b8.prec_elem = 0x1c;
              local_4b8.data._M_elems[0] = 0;
              local_4b8.data._M_elems[1] = 0;
              local_4b8.data._M_elems[2] = 0;
              local_4b8.data._M_elems[3] = 0;
              local_4b8.data._M_elems[4] = 0;
              local_4b8.data._M_elems[5] = 0;
              local_4b8.data._M_elems[6] = 0;
              local_4b8.data._M_elems[7] = 0;
              local_4b8.data._M_elems[8] = 0;
              local_4b8.data._M_elems[9] = 0;
              local_4b8.data._M_elems[10] = 0;
              local_4b8.data._M_elems[0xb] = 0;
              local_4b8.data._M_elems[0xc] = 0;
              local_4b8.data._M_elems[0xd] = 0;
              local_4b8.data._M_elems[0xe] = 0;
              local_4b8.data._M_elems[0xf] = 0;
              local_4b8.data._M_elems[0x10] = 0;
              local_4b8.data._M_elems[0x11] = 0;
              local_4b8.data._M_elems[0x12] = 0;
              local_4b8.data._M_elems[0x13] = 0;
              local_4b8.data._M_elems[0x14] = 0;
              local_4b8.data._M_elems[0x15] = 0;
              local_4b8.data._M_elems[0x16] = 0;
              local_4b8.data._M_elems[0x17] = 0;
              local_4b8.data._M_elems[0x18] = 0;
              local_4b8.data._M_elems[0x19] = 0;
              local_4b8.data._M_elems._104_5_ = 0;
              local_4b8.data._M_elems[0x1b]._1_3_ = 0;
              local_4b8.exp = 0;
              local_4b8.neg = false;
              local_3b8.data._M_elems._0_8_ = (long)SVar3;
              boost::multiprecision::default_ops::
              eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                        (&local_4b8,&local_438,(longlong *)&local_3b8);
              local_338.data._M_elems._0_8_ =
                   SEXT48((this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesense);
              local_3b8.fpclass = cpp_dec_float_finite;
              local_3b8.prec_elem = 0x1c;
              local_3b8.data._M_elems[0] = 0;
              local_3b8.data._M_elems[1] = 0;
              local_3b8.data._M_elems[2] = 0;
              local_3b8.data._M_elems[3] = 0;
              local_3b8.data._M_elems[4] = 0;
              local_3b8.data._M_elems[5] = 0;
              local_3b8.data._M_elems[6] = 0;
              local_3b8.data._M_elems[7] = 0;
              local_3b8.data._M_elems[8] = 0;
              local_3b8.data._M_elems[9] = 0;
              local_3b8.data._M_elems[10] = 0;
              local_3b8.data._M_elems[0xb] = 0;
              local_3b8.data._M_elems[0xc] = 0;
              local_3b8.data._M_elems[0xd] = 0;
              local_3b8.data._M_elems[0xe] = 0;
              local_3b8.data._M_elems[0xf] = 0;
              local_3b8.data._M_elems[0x10] = 0;
              local_3b8.data._M_elems[0x11] = 0;
              local_3b8.data._M_elems[0x12] = 0;
              local_3b8.data._M_elems[0x13] = 0;
              local_3b8.data._M_elems[0x14] = 0;
              local_3b8.data._M_elems[0x15] = 0;
              local_3b8.data._M_elems[0x16] = 0;
              local_3b8.data._M_elems[0x17] = 0;
              local_3b8.data._M_elems[0x18] = 0;
              local_3b8.data._M_elems[0x19] = 0;
              local_3b8.data._M_elems._104_5_ = 0;
              local_3b8.data._M_elems[0x1b]._1_3_ = 0;
              local_3b8.exp = 0;
              local_3b8.neg = false;
              boost::multiprecision::default_ops::
              eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                        (&local_3b8,&this_00->m_backend,(longlong *)&local_338);
              if (((local_4b8.fpclass != cpp_dec_float_NaN) &&
                  (local_3b8.fpclass != cpp_dec_float_NaN)) &&
                 (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_4b8,&local_3b8), iVar7 < 1)) {
                (*(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x5f])(this);
                (*(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x6d])(&local_4b8,this);
                epsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_438,this);
                if (((local_4b8.fpclass != cpp_dec_float_NaN) &&
                    (local_438.fpclass != cpp_dec_float_NaN)) &&
                   (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      (&local_4b8,&local_438), iVar7 < 0)) {
                  local_4c0 = Tolerances::floatingPointOpttol
                                        ((this->
                                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         )._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
                  (*(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x6d])(&local_3b8,this);
                  local_138.fpclass = cpp_dec_float_finite;
                  local_138.prec_elem = 0x1c;
                  local_138.data._M_elems[0] = 0;
                  local_138.data._M_elems[1] = 0;
                  local_138.data._M_elems[2] = 0;
                  local_138.data._M_elems[3] = 0;
                  local_138.data._M_elems[4] = 0;
                  local_138.data._M_elems[5] = 0;
                  local_138.data._M_elems[6] = 0;
                  local_138.data._M_elems[7] = 0;
                  local_138.data._M_elems[8] = 0;
                  local_138.data._M_elems[9] = 0;
                  local_138.data._M_elems[10] = 0;
                  local_138.data._M_elems[0xb] = 0;
                  local_138.data._M_elems[0xc] = 0;
                  local_138.data._M_elems[0xd] = 0;
                  local_138.data._M_elems[0xe] = 0;
                  local_138.data._M_elems[0xf] = 0;
                  local_138.data._M_elems[0x10] = 0;
                  local_138.data._M_elems[0x11] = 0;
                  local_138.data._M_elems[0x12] = 0;
                  local_138.data._M_elems[0x13] = 0;
                  local_138.data._M_elems[0x14] = 0;
                  local_138.data._M_elems[0x15] = 0;
                  local_138.data._M_elems[0x16] = 0;
                  local_138.data._M_elems[0x17] = 0;
                  local_138.data._M_elems[0x18] = 0;
                  local_138.data._M_elems[0x19] = 0;
                  local_138.data._M_elems._104_5_ = 0;
                  local_138.data._M_elems[0x1b]._1_3_ = 0;
                  local_138.exp = 0;
                  local_138.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            (&local_138,&local_4c0,&local_3b8);
                  iVar7 = (*(this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray[0x74])(this,&local_138);
                  if ((char)iVar7 != '\0') {
                    SVar3 = (this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesense;
                    (*(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._vptr_ClassArray[0x5e])(&local_1b8,this);
                    local_338.fpclass = cpp_dec_float_finite;
                    local_338.prec_elem = 0x1c;
                    local_338.data._M_elems[0] = 0;
                    local_338.data._M_elems[1] = 0;
                    local_338.data._M_elems[2] = 0;
                    local_338.data._M_elems[3] = 0;
                    local_338.data._M_elems[4] = 0;
                    local_338.data._M_elems[5] = 0;
                    local_338.data._M_elems[6] = 0;
                    local_338.data._M_elems[7] = 0;
                    local_338.data._M_elems[8] = 0;
                    local_338.data._M_elems[9] = 0;
                    local_338.data._M_elems[10] = 0;
                    local_338.data._M_elems[0xb] = 0;
                    local_338.data._M_elems[0xc] = 0;
                    local_338.data._M_elems[0xd] = 0;
                    local_338.data._M_elems[0xe] = 0;
                    local_338.data._M_elems[0xf] = 0;
                    local_338.data._M_elems[0x10] = 0;
                    local_338.data._M_elems[0x11] = 0;
                    local_338.data._M_elems[0x12] = 0;
                    local_338.data._M_elems[0x13] = 0;
                    local_338.data._M_elems[0x14] = 0;
                    local_338.data._M_elems[0x15] = 0;
                    local_338.data._M_elems[0x16] = 0;
                    local_338.data._M_elems[0x17] = 0;
                    local_338.data._M_elems[0x18] = 0;
                    local_338.data._M_elems[0x19] = 0;
                    local_338.data._M_elems._104_5_ = 0;
                    local_338.data._M_elems[0x1b]._1_3_ = 0;
                    local_338.exp = 0;
                    local_338.neg = false;
                    local_4c8 = (long)SVar3;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                              (&local_338,&local_1b8,&local_4c8);
                    local_4c8 = (long)(this->
                                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).thesense;
                    local_238.fpclass = cpp_dec_float_finite;
                    local_238.prec_elem = 0x1c;
                    local_238.data._M_elems[0] = 0;
                    local_238.data._M_elems[1] = 0;
                    local_238.data._M_elems[2] = 0;
                    local_238.data._M_elems[3] = 0;
                    local_238.data._M_elems[4] = 0;
                    local_238.data._M_elems[5] = 0;
                    local_238.data._M_elems[6] = 0;
                    local_238.data._M_elems[7] = 0;
                    local_238.data._M_elems[8] = 0;
                    local_238.data._M_elems[9] = 0;
                    local_238.data._M_elems[10] = 0;
                    local_238.data._M_elems[0xb] = 0;
                    local_238.data._M_elems[0xc] = 0;
                    local_238.data._M_elems[0xd] = 0;
                    local_238.data._M_elems[0xe] = 0;
                    local_238.data._M_elems[0xf] = 0;
                    local_238.data._M_elems[0x10] = 0;
                    local_238.data._M_elems[0x11] = 0;
                    local_238.data._M_elems[0x12] = 0;
                    local_238.data._M_elems[0x13] = 0;
                    local_238.data._M_elems[0x14] = 0;
                    local_238.data._M_elems[0x15] = 0;
                    local_238.data._M_elems[0x16] = 0;
                    local_238.data._M_elems[0x17] = 0;
                    local_238.data._M_elems[0x18] = 0;
                    local_238.data._M_elems[0x19] = 0;
                    local_238.data._M_elems._104_5_ = 0;
                    local_238.data._M_elems[0x1b]._1_3_ = 0;
                    local_238.exp = 0;
                    local_238.neg = false;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                              (&local_238,&this_00->m_backend,&local_4c8);
                    if (((local_338.fpclass != cpp_dec_float_NaN) &&
                        (local_238.fpclass != cpp_dec_float_NaN)) &&
                       (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                compare(&local_338,&local_238), iVar7 < 1)) {
                      pSVar8 = this->spxout;
                      if ((pSVar8 != (SPxOut *)0x0) && (3 < (int)pSVar8->m_verbosity)) {
                        local_4b8.data._M_elems[0] = pSVar8->m_verbosity;
                        local_438.data._M_elems[0] = 4;
                        (*pSVar8->_vptr_SPxOut[2])();
                        pSVar8 = soplex::operator<<(this->spxout," --- objective value limit (");
                        pnVar14 = &local_b0;
                        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                          (pnVar14->m_backend).data._M_elems[0] =
                               (this_00->m_backend).data._M_elems[0];
                          this_00 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)this_00 + (ulong)bVar16 * -8 + 4);
                          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)pnVar14 + ((ulong)bVar16 * -2 + 1) * 4);
                        }
                        local_b0.m_backend.exp = (this->objLimit).m_backend.exp;
                        local_b0.m_backend.neg = (this->objLimit).m_backend.neg;
                        local_b0.m_backend.fpclass = (this->objLimit).m_backend.fpclass;
                        local_b0.m_backend.prec_elem = (this->objLimit).m_backend.prec_elem;
                        boost::multiprecision::operator<<
                                  (pSVar8->m_streams[pSVar8->m_verbosity],&local_b0);
                        pSVar8 = soplex::operator<<(pSVar8,") reached");
                        std::endl<char,std::char_traits<char>>
                                  (pSVar8->m_streams[pSVar8->m_verbosity]);
                        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_4b8);
                      }
                      (*(this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._vptr_ClassArray[0x5e])(&local_4b8,this);
                      iVar7 = -5;
                      goto LAB_004deb57;
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar7 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).iterCount;
      lVar15 = 0x414;
      bVar10 = false;
    }
  }
LAB_004deb57:
  *(int *)((long)&(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray + lVar15) = iVar7;
  return bVar10;
}

Assistant:

bool SPxSolverBase<R>::terminate()
{
#ifdef ENABLE_ADDITIONAL_CHECKS

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::SINGULAR)
      testVecs();

#endif

   int redo = dim();

   if(redo < 1000)
      redo = 1000;

   if(this->iteration() > 10 && this->iteration() % redo == 0)
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      VectorBase<R> cr(*theCoPrhs);
      VectorBase<R> fr(*theFrhs);
#endif

      if(type() == ENTER)
         computeEnterCoPrhs();
      else
         computeLeaveCoPrhs();

      computeFrhs();

#ifdef ENABLE_ADDITIONAL_CHECKS
      cr -= *theCoPrhs;
      fr -= *theFrhs;

      if(cr.length() > leavetol())
         SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WSOLVE50 unexpected change of coPrhs "
                         << cr.length() << std::endl;)
         if(fr.length() > entertol())
            SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WSOLVE51 unexpected change of   Frhs "
                            << fr.length() << std::endl;)
#endif

            if(this->updateCount > 1)
            {
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << " --- terminate triggers refactorization"
                             << std::endl;)
               factorize();
            }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      if(pricing() == FULL)
      {
         computePvec();

         if(type() == ENTER)
         {
            computeCoTest();
            computeTest();
         }
      }

      if(shift() > 0.0)
         unShift();
   }

   // check time limit and objective limit only for non-terminal bases
   if(SPxBasisBase<R>::status() >= SPxBasisBase<R>::OPTIMAL  ||
         SPxBasisBase<R>::status() <= SPxBasisBase<R>::SINGULAR)
   {
      m_status = UNKNOWN;
      return true;
   }

   if(isTimeLimitReached())
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- timelimit (" << maxTime
                    << ") reached" << std::endl;)
      m_status = ABORT_TIME;
      return true;
   }

   // objLimit is set and we are running DUAL:
   // - objLimit is set if objLimit < R(infinity)
   // - DUAL is running if rep() * type() > 0 == DUAL (-1 == PRIMAL)
   //
   // In this case we have given a objective value limit, e.g, through a
   // MIP solver, and we want stop solving the LP if we figure out that the
   // optimal value of the current LP can not be better then this objective
   // limit. More precisely:
   // - MINIMIZATION Problem
   //   We want stop the solving process if
   //   objLimit <= current objective value of the DUAL LP
   // - MAXIMIZATION Problem
   //   We want stop the solving process if
   //   objLimit >= current objective value of the DUAL LP
   if(objLimit < R(infinity) && type() * rep() > 0)
   {
      // We have no bound shifts; therefore, we can trust the current
      // objective value.
      // It might be even possible to use this termination value in case of
      // bound violations (shifting) but in this case it is quite difficult
      // to determine if we already reached the limit.
      if(shift() < epsilon() && noViols(tolerances()->floatingPointOpttol() - shift()))
      {
         // SPxSense::MINIMIZE == -1, so we have sign = 1 on minimizing
         if(int(this->spxSense()) * value() <= int(this->spxSense()) * objLimit)
         {
            // ensure that solution is accurate
            factorizeAndRecompute();

            // check no violations and objective limit again
            if(shift() < epsilon() && noViols(tolerances()->floatingPointOpttol() - shift())
                  && int(this->spxSense()) * value() <= int(this->spxSense()) * objLimit)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- objective value limit (" << objLimit
                             << ") reached" << std::endl;)
               SPxOut::debug(this, " --- objective value limit reached\n (value:{} limit:{})\n", value(),
                             objLimit);
               SPxOut::debug(this, " (spxSense:{} rep:{} type:{})\n", int(this->spxSense()), int(rep()),
                             int(type()));

               m_status = ABORT_VALUE;
               return true;
            }
         }
      }
   }

   this->lastIterCount = this->iterCount;

   return false;
}